

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_r8_ugrid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  char *yp_21;
  char *xp_21;
  int y_21;
  REF_STATUS ref_private_macro_code_rss_8;
  char *yp_20;
  char *xp_20;
  int y_20;
  REF_STATUS ref_private_macro_code_rss_7;
  char *yp_19;
  char *xp_19;
  int y_19;
  REF_STATUS ref_private_macro_code_rss_6;
  char *yp_18;
  char *xp_18;
  int y_18;
  REF_STATUS ref_private_macro_code_rss_5;
  char *yp_17;
  char *xp_17;
  int y_17;
  char *yp_16;
  char *xp_16;
  int y_16;
  char *yp_15;
  char *xp_15;
  int y_15;
  REF_STATUS ref_private_macro_code_rss_4;
  char *yp_14;
  char *xp_14;
  int y_14;
  REF_STATUS ref_private_macro_code_rss_3;
  char *yp_13;
  char *xp_13;
  int y_13;
  REF_STATUS ref_private_macro_code_rss_2;
  char *yp_12;
  char *xp_12;
  double y_12;
  char *yp_11;
  char *xp_11;
  double y_11;
  char *yp_10;
  char *xp_10;
  double y_10;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  char *yp_9;
  char *xp_9;
  int y_9;
  char *yp_8;
  char *xp_8;
  int y_8;
  char *yp_7;
  char *xp_7;
  int y_7;
  char *yp_6;
  char *xp_6;
  int y_6;
  char *yp_5;
  char *xp_5;
  int y_5;
  char *yp_4;
  char *xp_4;
  int y_4;
  char *yp_3;
  char *xp_3;
  int y_3;
  char *yp_2;
  char *xp_2;
  int y_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  char *yp_1;
  char *xp_1;
  int y_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char *yp;
  char *xp;
  int y;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT fortran_record_size;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT node_per;
  REF_INT face_id;
  REF_INT new_qua;
  REF_INT new_tri;
  REF_INT qua;
  REF_INT tri;
  REF_INT nodes [27];
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  REF_DBL swapped_dbl;
  int local_68;
  REF_INT new_node;
  REF_INT node;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)ref_mpi_local;
    ref_cell = *(REF_CELL *)&ref_node->blank;
    _ntri = fopen((char *)ref_grid,"r");
    if (_ntri == (FILE *)0x0) {
      printf("unable to open %s\n",ref_grid);
    }
    if (_ntri == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x28c,"ref_import_r8_ugrid","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      sVar2 = fread(&y,4,1,_ntri);
      if (sVar2 == 1) {
        xp._7_1_ = (undefined1)y;
        xp._6_1_ = y._1_1_;
        xp._5_1_ = y._2_1_;
        xp._4_1_ = y._3_1_;
        y = xp._4_4_;
        if ((long)xp._4_4_ == 0x1c) {
          sVar2 = fread(&nqua,4,1,_ntri);
          if (sVar2 == 1) {
            sVar2 = fread(&ntet,4,1,_ntri);
            if (sVar2 == 1) {
              sVar2 = fread(&npyr,4,1,_ntri);
              if (sVar2 == 1) {
                sVar2 = fread(&npri,4,1,_ntri);
                if (sVar2 == 1) {
                  sVar2 = fread(&nhex,4,1,_ntri);
                  if (sVar2 == 1) {
                    sVar2 = fread(&node,4,1,_ntri);
                    if (sVar2 == 1) {
                      sVar2 = fread(&new_node,4,1,_ntri);
                      if (sVar2 == 1) {
                        sVar2 = fread(&y,4,1,_ntri);
                        if (sVar2 == 1) {
                          xp_1._7_1_ = (undefined1)y;
                          xp_1._6_1_ = y._1_1_;
                          xp_1._5_1_ = y._2_1_;
                          xp_1._4_1_ = y._3_1_;
                          y = xp_1._4_4_;
                          if ((long)xp_1._4_4_ == 0x1c) {
                            xp_2._7_1_ = (undefined1)nqua;
                            xp_2._6_1_ = nqua._1_1_;
                            xp_2._5_1_ = nqua._2_1_;
                            xp_2._4_1_ = nqua._3_1_;
                            nqua = xp_2._4_4_;
                            xp_3._7_1_ = (undefined1)ntet;
                            xp_3._6_1_ = ntet._1_1_;
                            xp_3._5_1_ = ntet._2_1_;
                            xp_3._4_1_ = ntet._3_1_;
                            ntet = xp_3._4_4_;
                            xp_4._7_1_ = (undefined1)npyr;
                            xp_4._6_1_ = npyr._1_1_;
                            xp_4._5_1_ = npyr._2_1_;
                            xp_4._4_1_ = npyr._3_1_;
                            npyr = xp_4._4_4_;
                            xp_5._7_1_ = (undefined1)npri;
                            xp_5._6_1_ = npri._1_1_;
                            xp_5._5_1_ = npri._2_1_;
                            xp_5._4_1_ = npri._3_1_;
                            npri = xp_5._4_4_;
                            xp_6._7_1_ = (undefined1)nhex;
                            xp_6._6_1_ = nhex._1_1_;
                            xp_6._5_1_ = nhex._2_1_;
                            xp_6._4_1_ = nhex._3_1_;
                            nhex = xp_6._4_4_;
                            xp_7._7_1_ = (undefined1)node;
                            xp_7._6_1_ = node._1_1_;
                            xp_7._5_1_ = node._2_1_;
                            xp_7._4_1_ = node._3_1_;
                            node = xp_7._4_4_;
                            xp_8._7_1_ = (undefined1)new_node;
                            xp_8._6_1_ = new_node._1_1_;
                            xp_8._5_1_ = new_node._2_1_;
                            xp_8._4_1_ = new_node._3_1_;
                            new_node = xp_8._4_4_;
                            sVar2 = fread(&y,4,1,_ntri);
                            if (sVar2 == 1) {
                              xp_9._7_1_ = (undefined1)y;
                              xp_9._6_1_ = y._1_1_;
                              xp_9._5_1_ = y._2_1_;
                              xp_9._4_1_ = y._3_1_;
                              y = xp_9._4_4_;
                              lVar3 = (long)(nqua * 0x18 + ntet * 0x10 + npyr * 0x14 + npri * 0x10 +
                                             nhex * 0x14 + node * 0x18 + new_node * 0x20);
                              if (lVar3 == xp_9._4_4_) {
                                for (local_68 = 0; local_68 < nqua; local_68 = local_68 + 1) {
                                  uVar1 = ref_node_add((REF_NODE)ref_cell,(long)local_68,
                                                       (REF_INT *)((long)&swapped_dbl + 4));
                                  if (uVar1 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x2ad,"ref_import_r8_ugrid",(ulong)uVar1,"new_node");
                                    return uVar1;
                                  }
                                  if (local_68 != swapped_dbl._4_4_) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x2ae,"ref_import_r8_ugrid","node index");
                                    return 1;
                                  }
                                  sVar2 = fread(nodes + 0x1a,8,1,_ntri);
                                  if (sVar2 != 1) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x2af,"ref_import_r8_ugrid","x");
                                    return 1;
                                  }
                                  xp_10._7_1_ = (undefined1)nodes[0x1a];
                                  xp_10._6_1_ = nodes[0x1a]._1_1_;
                                  xp_10._5_1_ = nodes[0x1a]._2_1_;
                                  xp_10._4_1_ = nodes[0x1a]._3_1_;
                                  xp_10._3_1_ = uStack_74;
                                  xp_10._2_1_ = uStack_73;
                                  xp_10._1_1_ = uStack_72;
                                  xp_10._0_1_ = uStack_71;
                                  stack0xffffffffffffff88 = xp_10;
                                  *(char **)(ref_cell->c2n + (long)(swapped_dbl._4_4_ * 0xf) * 2) =
                                       xp_10;
                                  sVar2 = fread(nodes + 0x1a,8,1,_ntri);
                                  if (sVar2 != 1) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x2b2,"ref_import_r8_ugrid","y");
                                    return 1;
                                  }
                                  xp_11._7_1_ = (undefined1)nodes[0x1a];
                                  xp_11._6_1_ = nodes[0x1a]._1_1_;
                                  xp_11._5_1_ = nodes[0x1a]._2_1_;
                                  xp_11._4_1_ = nodes[0x1a]._3_1_;
                                  xp_11._3_1_ = uStack_74;
                                  xp_11._2_1_ = uStack_73;
                                  xp_11._1_1_ = uStack_72;
                                  xp_11._0_1_ = uStack_71;
                                  stack0xffffffffffffff88 = xp_11;
                                  *(char **)(ref_cell->c2n + (long)(swapped_dbl._4_4_ * 0xf + 1) * 2
                                            ) = xp_11;
                                  sVar2 = fread(nodes + 0x1a,8,1,_ntri);
                                  if (sVar2 != 1) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x2b5,"ref_import_r8_ugrid","z");
                                    return 1;
                                  }
                                  xp_12._7_1_ = (undefined1)nodes[0x1a];
                                  xp_12._6_1_ = nodes[0x1a]._1_1_;
                                  xp_12._5_1_ = nodes[0x1a]._2_1_;
                                  xp_12._4_1_ = nodes[0x1a]._3_1_;
                                  xp_12._3_1_ = uStack_74;
                                  xp_12._2_1_ = uStack_73;
                                  xp_12._1_1_ = uStack_72;
                                  xp_12._0_1_ = uStack_71;
                                  unique0x00006b80 = xp_12;
                                  *(char **)(ref_cell->c2n + (long)(swapped_dbl._4_4_ * 0xf + 2) * 2
                                            ) = xp_12;
                                }
                                uVar1 = ref_node_initialize_n_global((REF_NODE)ref_cell,(long)nqua);
                                if (uVar1 == 0) {
                                  file = (FILE *)ref_node->part;
                                  nodes[1] = -1;
                                  for (new_tri = 0; new_tri < ntet; new_tri = new_tri + 1) {
                                    new_cell = *(REF_INT *)((long)&file->_IO_read_ptr + 4);
                                    for (local_68 = 0; local_68 < new_cell; local_68 = local_68 + 1)
                                    {
                                      sVar2 = fread(&qua + local_68,4,1,_ntri);
                                      if (sVar2 != 1) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                               ,0x2c1,"ref_import_r8_ugrid","tri");
                                        return 1;
                                      }
                                      lVar3 = (long)local_68 * 4;
                                      xp_13._3_1_ = (char)(&qua)[local_68];
                                      xp_13._2_1_ = *(undefined1 *)((long)&qua + lVar3 + 1);
                                      xp_13._1_1_ = *(undefined1 *)((long)&qua + lVar3 + 2);
                                      xp_13._0_1_ = *(undefined1 *)((long)&qua + lVar3 + 3);
                                      (&qua)[local_68] = (REF_INT)xp_13;
                                      (&qua)[local_68] = (&qua)[local_68] + -1;
                                    }
                                    uVar1 = ref_cell_add((REF_CELL)file,&qua,&face_id);
                                    if (uVar1 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2c5,"ref_import_r8_ugrid",(ulong)uVar1,"new tri");
                                      return uVar1;
                                    }
                                    if (new_tri != face_id) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2c6,"ref_import_r8_ugrid","tri index");
                                      return 1;
                                    }
                                  }
                                  file = *(FILE **)&ref_node->naux;
                                  nodes[2] = -1;
                                  for (new_qua = 0; new_qua < npyr; new_qua = new_qua + 1) {
                                    new_cell = *(REF_INT *)((long)&file->_IO_read_ptr + 4);
                                    for (local_68 = 0; local_68 < new_cell; local_68 = local_68 + 1)
                                    {
                                      sVar2 = fread(&qua + local_68,4,1,_ntri);
                                      if (sVar2 != 1) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                               ,0x2ce,"ref_import_r8_ugrid","qua");
                                        return 1;
                                      }
                                      lVar3 = (long)local_68 * 4;
                                      xp_14._3_1_ = (char)(&qua)[local_68];
                                      xp_14._2_1_ = *(undefined1 *)((long)&qua + lVar3 + 1);
                                      xp_14._1_1_ = *(undefined1 *)((long)&qua + lVar3 + 2);
                                      xp_14._0_1_ = *(undefined1 *)((long)&qua + lVar3 + 3);
                                      (&qua)[local_68] = (REF_INT)xp_14;
                                      (&qua)[local_68] = (&qua)[local_68] + -1;
                                    }
                                    uVar1 = ref_cell_add((REF_CELL)file,&qua,&node_per);
                                    if (uVar1 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2d2,"ref_import_r8_ugrid",(ulong)uVar1,"new qua");
                                      return uVar1;
                                    }
                                    if (new_qua != node_per) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2d3,"ref_import_r8_ugrid","qua index");
                                      return 1;
                                    }
                                  }
                                  file = (FILE *)ref_node->part;
                                  for (new_tri = 0; new_tri < ntet; new_tri = new_tri + 1) {
                                    sVar2 = fread(&cell,4,1,_ntri);
                                    if (sVar2 != 1) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2d8,"ref_import_r8_ugrid","tri");
                                      return 1;
                                    }
                                    xp_15._3_1_ = (undefined1)cell;
                                    xp_15._2_1_ = cell._1_1_;
                                    xp_15._1_1_ = cell._2_1_;
                                    xp_15._0_1_ = cell._3_1_;
                                    cell = (REF_INT)xp_15;
                                    *(REF_INT *)
                                     (file->_IO_buf_base +
                                     (long)(*(int *)&file->_IO_read_ptr * new_tri + 3) * 4) =
                                         (REF_INT)xp_15;
                                  }
                                  file = *(FILE **)&ref_node->naux;
                                  for (new_qua = 0; new_qua < npyr; new_qua = new_qua + 1) {
                                    sVar2 = fread(&cell,4,1,_ntri);
                                    if (sVar2 != 1) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2df,"ref_import_r8_ugrid","qua");
                                      return 1;
                                    }
                                    xp_16._7_1_ = (undefined1)cell;
                                    xp_16._6_1_ = cell._1_1_;
                                    xp_16._5_1_ = cell._2_1_;
                                    xp_16._4_1_ = cell._3_1_;
                                    cell = xp_16._4_4_;
                                    *(REF_INT *)
                                     (file->_IO_buf_base +
                                     (long)(*(int *)&file->_IO_read_ptr * new_qua + 4) * 4) =
                                         xp_16._4_4_;
                                  }
                                  file = (FILE *)ref_node->ref_mpi;
                                  for (fortran_record_size = 0; fortran_record_size < npri;
                                      fortran_record_size = fortran_record_size + 1) {
                                    new_cell = *(REF_INT *)((long)&file->_IO_read_ptr + 4);
                                    for (local_68 = 0; local_68 < new_cell; local_68 = local_68 + 1)
                                    {
                                      sVar2 = fread(&qua + local_68,4,1,_ntri);
                                      if (sVar2 != 1) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                               ,0x2e8,"ref_import_r8_ugrid","tet");
                                        return 1;
                                      }
                                      lVar3 = (long)local_68 * 4;
                                      xp_17._7_1_ = (char)(&qua)[local_68];
                                      xp_17._6_1_ = *(undefined1 *)((long)&qua + lVar3 + 1);
                                      xp_17._5_1_ = *(undefined1 *)((long)&qua + lVar3 + 2);
                                      xp_17._4_1_ = *(undefined1 *)((long)&qua + lVar3 + 3);
                                      (&qua)[local_68] = xp_17._4_4_;
                                      (&qua)[local_68] = (&qua)[local_68] + -1;
                                    }
                                    uVar1 = ref_cell_add((REF_CELL)file,&qua,
                                                         &ref_private_macro_code_rss);
                                    if (uVar1 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2ec,"ref_import_r8_ugrid",(ulong)uVar1,"tet cell");
                                      return uVar1;
                                    }
                                    if (fortran_record_size != ref_private_macro_code_rss) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2ed,"ref_import_r8_ugrid","tet index");
                                      return 1;
                                    }
                                  }
                                  file = *(FILE **)&ref_node->n_unused;
                                  for (fortran_record_size = 0; fortran_record_size < nhex;
                                      fortran_record_size = fortran_record_size + 1) {
                                    new_cell = *(REF_INT *)((long)&file->_IO_read_ptr + 4);
                                    for (local_68 = 0; local_68 < new_cell; local_68 = local_68 + 1)
                                    {
                                      sVar2 = fread(&qua + local_68,4,1,_ntri);
                                      if (sVar2 != 1) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                               ,0x2f4,"ref_import_r8_ugrid","pyr");
                                        return 1;
                                      }
                                      lVar3 = (long)local_68 * 4;
                                      xp_18._3_1_ = (char)(&qua)[local_68];
                                      xp_18._2_1_ = *(undefined1 *)((long)&qua + lVar3 + 1);
                                      xp_18._1_1_ = *(undefined1 *)((long)&qua + lVar3 + 2);
                                      xp_18._0_1_ = *(undefined1 *)((long)&qua + lVar3 + 3);
                                      (&qua)[local_68] = (REF_INT)xp_18;
                                      (&qua)[local_68] = (&qua)[local_68] + -1;
                                    }
                                    uVar1 = ref_cell_add((REF_CELL)file,&qua,
                                                         &ref_private_macro_code_rss);
                                    if (uVar1 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2f8,"ref_import_r8_ugrid",(ulong)uVar1,"pyr cell");
                                      return uVar1;
                                    }
                                    if (fortran_record_size != ref_private_macro_code_rss) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x2f9,"ref_import_r8_ugrid","pyr index");
                                      return 1;
                                    }
                                  }
                                  file = (FILE *)ref_node->unused_global;
                                  for (fortran_record_size = 0; fortran_record_size < node;
                                      fortran_record_size = fortran_record_size + 1) {
                                    new_cell = *(REF_INT *)((long)&file->_IO_read_ptr + 4);
                                    for (local_68 = 0; local_68 < new_cell; local_68 = local_68 + 1)
                                    {
                                      sVar2 = fread(&qua + local_68,4,1,_ntri);
                                      if (sVar2 != 1) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                               ,0x300,"ref_import_r8_ugrid","pri");
                                        return 1;
                                      }
                                      lVar3 = (long)local_68 * 4;
                                      xp_19._3_1_ = (char)(&qua)[local_68];
                                      xp_19._2_1_ = *(undefined1 *)((long)&qua + lVar3 + 1);
                                      xp_19._1_1_ = *(undefined1 *)((long)&qua + lVar3 + 2);
                                      xp_19._0_1_ = *(undefined1 *)((long)&qua + lVar3 + 3);
                                      (&qua)[local_68] = (REF_INT)xp_19;
                                      (&qua)[local_68] = (&qua)[local_68] + -1;
                                    }
                                    uVar1 = ref_cell_add((REF_CELL)file,&qua,
                                                         &ref_private_macro_code_rss);
                                    if (uVar1 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x304,"ref_import_r8_ugrid",(ulong)uVar1,"pri cell");
                                      return uVar1;
                                    }
                                    if (fortran_record_size != ref_private_macro_code_rss) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x305,"ref_import_r8_ugrid","pri index");
                                      return 1;
                                    }
                                  }
                                  file = (FILE *)ref_node->old_n_global;
                                  for (fortran_record_size = 0; fortran_record_size < new_node;
                                      fortran_record_size = fortran_record_size + 1) {
                                    new_cell = *(REF_INT *)((long)&file->_IO_read_ptr + 4);
                                    for (local_68 = 0; local_68 < new_cell; local_68 = local_68 + 1)
                                    {
                                      sVar2 = fread(&qua + local_68,4,1,_ntri);
                                      if (sVar2 != 1) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                               ,0x30c,"ref_import_r8_ugrid","hex");
                                        return 1;
                                      }
                                      lVar3 = (long)local_68 * 4;
                                      xp_20._3_1_ = (char)(&qua)[local_68];
                                      xp_20._2_1_ = *(undefined1 *)((long)&qua + lVar3 + 1);
                                      xp_20._1_1_ = *(undefined1 *)((long)&qua + lVar3 + 2);
                                      xp_20._0_1_ = *(undefined1 *)((long)&qua + lVar3 + 3);
                                      (&qua)[local_68] = (REF_INT)xp_20;
                                      (&qua)[local_68] = (&qua)[local_68] + -1;
                                    }
                                    uVar1 = ref_cell_add((REF_CELL)file,&qua,
                                                         &ref_private_macro_code_rss);
                                    if (uVar1 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x310,"ref_import_r8_ugrid",(ulong)uVar1,"hex cell");
                                      return uVar1;
                                    }
                                    if (fortran_record_size != ref_private_macro_code_rss) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x311,"ref_import_r8_ugrid","hex index");
                                      return 1;
                                    }
                                  }
                                  sVar2 = fread(&y,4,1,_ntri);
                                  if (sVar2 == 1) {
                                    xp_21._3_1_ = (undefined1)y;
                                    xp_21._2_1_ = y._1_1_;
                                    xp_21._1_1_ = y._2_1_;
                                    xp_21._0_1_ = y._3_1_;
                                    y = (int)xp_21;
                                    lVar3 = (long)(nqua * 0x18 + ntet * 0x10 + npyr * 0x14 +
                                                   npri * 0x10 + nhex * 0x14 + node * 0x18 +
                                                  new_node * 0x20);
                                    if (lVar3 == (int)xp_21) {
                                      fclose(_ntri);
                                      ref_grid_ptr_local._4_4_ = 0;
                                    }
                                    else {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x318,"ref_import_r8_ugrid","block end record size",
                                             lVar3,(long)(int)xp_21);
                                      ref_grid_ptr_local._4_4_ = 1;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x314,"ref_import_r8_ugrid","nnode");
                                    ref_grid_ptr_local._4_4_ = 1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                         ,0x2ba,"ref_import_r8_ugrid",(ulong)uVar1,"init glob");
                                  ref_grid_ptr_local._4_4_ = uVar1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x2aa,"ref_import_r8_ugrid","block start record size",lVar3,
                                       (long)xp_9._4_4_);
                                ref_grid_ptr_local._4_4_ = 1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                     ,0x2a6,"ref_import_r8_ugrid","nnode");
                              ref_grid_ptr_local._4_4_ = 1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x29c,"ref_import_r8_ugrid","header end record size",0x1c,
                                   (long)xp_1._4_4_);
                            ref_grid_ptr_local._4_4_ = 1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x29a,"ref_import_r8_ugrid","nnode");
                          ref_grid_ptr_local._4_4_ = 1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x298,"ref_import_r8_ugrid","nhex");
                        ref_grid_ptr_local._4_4_ = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x297,"ref_import_r8_ugrid","npri");
                      ref_grid_ptr_local._4_4_ = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x296,"ref_import_r8_ugrid","npyr");
                    ref_grid_ptr_local._4_4_ = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x295,"ref_import_r8_ugrid","ntet");
                  ref_grid_ptr_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x294,"ref_import_r8_ugrid","nqua");
                ref_grid_ptr_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x293,"ref_import_r8_ugrid","ntri");
              ref_grid_ptr_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x292,"ref_import_r8_ugrid","nnode");
            ref_grid_ptr_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x290,"ref_import_r8_ugrid","header start record size",0x1c,(long)xp._4_4_);
          ref_grid_ptr_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x28e,"ref_import_r8_ugrid","nnode");
        ref_grid_ptr_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x286,
           "ref_import_r8_ugrid",(ulong)uVar1,"create grid");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_r8_ugrid(REF_GRID *ref_grid_ptr,
                                              REF_MPI ref_mpi,
                                              const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;
  REF_INT node, new_node;
  REF_DBL swapped_dbl;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tri, qua, new_tri, new_qua;
  REF_INT face_id;
  REF_INT node_per, cell, new_cell;
  REF_INT fortran_record_size;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fread(&fortran_record_size, sizeof(REF_INT), 1, file), "nnode");
  SWAP_INT(fortran_record_size);
  REIS(7 * 4, fortran_record_size, "header start record size");

  RES(1, fread(&nnode, sizeof(REF_INT), 1, file), "nnode");
  RES(1, fread(&ntri, sizeof(REF_INT), 1, file), "ntri");
  RES(1, fread(&nqua, sizeof(REF_INT), 1, file), "nqua");
  RES(1, fread(&ntet, sizeof(REF_INT), 1, file), "ntet");
  RES(1, fread(&npyr, sizeof(REF_INT), 1, file), "npyr");
  RES(1, fread(&npri, sizeof(REF_INT), 1, file), "npri");
  RES(1, fread(&nhex, sizeof(REF_INT), 1, file), "nhex");

  RES(1, fread(&fortran_record_size, sizeof(REF_INT), 1, file), "nnode");
  SWAP_INT(fortran_record_size);
  REIS(7 * 4, fortran_record_size, "header end record size");

  SWAP_INT(nnode);
  SWAP_INT(ntri);
  SWAP_INT(nqua);
  SWAP_INT(ntet);
  SWAP_INT(npyr);
  SWAP_INT(npri);
  SWAP_INT(nhex);

  RES(1, fread(&fortran_record_size, sizeof(REF_INT), 1, file), "nnode");
  SWAP_INT(fortran_record_size);
  REIS(nnode * 3 * 8 + ntri * 4 * 4 + nqua * 5 * 4 + ntet * 4 * 4 +
           npyr * 5 * 4 + npri * 6 * 4 + nhex * 8 * 4,
       fortran_record_size, "block start record size");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fread(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
    SWAP_DBL(swapped_dbl);
    ref_node_xyz(ref_node, 0, new_node) = swapped_dbl;
    RES(1, fread(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
    SWAP_DBL(swapped_dbl);
    ref_node_xyz(ref_node, 1, new_node) = swapped_dbl;
    RES(1, fread(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
    SWAP_DBL(swapped_dbl);
    ref_node_xyz(ref_node, 2, new_node) = swapped_dbl;
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    node_per = ref_cell_node_per(ref_cell);
    for (node = 0; node < node_per; node++) {
      RES(1, fread(&(nodes[node]), sizeof(REF_INT), 1, file), "tri");
      SWAP_INT(nodes[node]);
      nodes[node]--;
    }
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_qua(ref_grid);
  nodes[4] = REF_EMPTY;
  for (qua = 0; qua < nqua; qua++) {
    node_per = ref_cell_node_per(ref_cell);
    for (node = 0; node < node_per; node++) {
      RES(1, fread(&(nodes[node]), sizeof(REF_INT), 1, file), "qua");
      SWAP_INT(nodes[node]);
      nodes[node]--;
    }
    RSS(ref_cell_add(ref_cell, nodes, &new_qua), "new qua");
    RES(qua, new_qua, "qua index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fread(&face_id, sizeof(REF_INT), 1, file), "tri");
    SWAP_INT(face_id);
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  ref_cell = ref_grid_qua(ref_grid);
  for (qua = 0; qua < nqua; qua++) {
    RES(1, fread(&face_id, sizeof(REF_INT), 1, file), "qua");
    SWAP_INT(face_id);
    ref_cell_c2n(ref_cell, 4, qua) = face_id;
  }

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    node_per = ref_cell_node_per(ref_cell);
    for (node = 0; node < node_per; node++) {
      RES(1, fread(&(nodes[node]), sizeof(REF_INT), 1, file), "tet");
      SWAP_INT(nodes[node]);
      nodes[node]--;
    }
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "tet cell");
    RES(cell, new_cell, "tet index");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  for (cell = 0; cell < npyr; cell++) {
    node_per = ref_cell_node_per(ref_cell);
    for (node = 0; node < node_per; node++) {
      RES(1, fread(&(nodes[node]), sizeof(REF_INT), 1, file), "pyr");
      SWAP_INT(nodes[node]);
      nodes[node]--;
    }
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "pyr cell");
    RES(cell, new_cell, "pyr index");
  }

  ref_cell = ref_grid_pri(ref_grid);
  for (cell = 0; cell < npri; cell++) {
    node_per = ref_cell_node_per(ref_cell);
    for (node = 0; node < node_per; node++) {
      RES(1, fread(&(nodes[node]), sizeof(REF_INT), 1, file), "pri");
      SWAP_INT(nodes[node]);
      nodes[node]--;
    }
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "pri cell");
    RES(cell, new_cell, "pri index");
  }

  ref_cell = ref_grid_hex(ref_grid);
  for (cell = 0; cell < nhex; cell++) {
    node_per = ref_cell_node_per(ref_cell);
    for (node = 0; node < node_per; node++) {
      RES(1, fread(&(nodes[node]), sizeof(REF_INT), 1, file), "hex");
      SWAP_INT(nodes[node]);
      nodes[node]--;
    }
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "hex cell");
    RES(cell, new_cell, "hex index");
  }

  RES(1, fread(&fortran_record_size, sizeof(REF_INT), 1, file), "nnode");
  SWAP_INT(fortran_record_size);
  REIS(nnode * 3 * 8 + ntri * 4 * 4 + nqua * 5 * 4 + ntet * 4 * 4 +
           npyr * 5 * 4 + npri * 6 * 4 + nhex * 8 * 4,
       fortran_record_size, "block end record size");

  fclose(file);

  return REF_SUCCESS;
}